

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerMSL::to_qualifiers_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,uint32_t id)

{
  Variant *pVVar1;
  StorageClass SVar2;
  int iVar3;
  ulong uVar4;
  SPIRVariable *pSVar5;
  SPIRType *pSVar6;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar4 = (ulong)id;
  if ((uVar4 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr, pVVar1[uVar4].type == TypeVariable)) {
    pSVar5 = Variant::get<spirv_cross::SPIRVariable>(pVVar1 + uVar4);
  }
  else {
    pSVar5 = (SPIRVariable *)0x0;
  }
  pSVar6 = Compiler::expression_type((Compiler *)this,id);
  SVar2 = pSVar6->storage;
  if (SVar2 == StorageClassTaskPayloadWorkgroupEXT) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    SVar2 = pSVar6->storage;
  }
  if (SVar2 != StorageClassWorkgroup) {
    if (pSVar5 == (SPIRVariable *)0x0) {
      return __return_storage_ptr__;
    }
    iVar3 = (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1c])(this,pSVar5,4);
    if ((char)iVar3 == '\0') {
      return __return_storage_ptr__;
    }
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_qualifiers_glsl(uint32_t id)
{
	string quals;

	auto *var = maybe_get<SPIRVariable>(id);
	auto &type = expression_type(id);

	if (type.storage == StorageClassTaskPayloadWorkgroupEXT)
		quals += "object_data ";

	if (type.storage == StorageClassWorkgroup || (var && variable_decl_is_remapped_storage(*var, StorageClassWorkgroup)))
		quals += "threadgroup ";

	return quals;
}